

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

shared_ptr<pstore::header> __thiscall
pstore::storage::address_to_pointer<pstore::header>
          (storage *this,typed_address<pstore::header> addr)

{
  address in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstore::header> sVar1;
  
  address_to_pointer_impl<pstore::storage,std::shared_ptr<void>>
            ((storage *)&stack0xffffffffffffffe0,(storage *)addr.a_.a_,in_RDX);
  std::static_pointer_cast<pstore::header,void>((shared_ptr<void> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  sVar1.super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<pstore::header>)
         sVar1.super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> address_to_pointer (typed_address<T> const addr) noexcept {
            return std::static_pointer_cast<T> (address_to_pointer (addr.to_address ()));
        }